

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigcache.cpp
# Opt level: O0

bool __thiscall
CachingTransactionSignatureChecker::VerifyECDSASignature
          (CachingTransactionSignatureChecker *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,CPubKey *pubkey,
          uint256 *sighash)

{
  long lVar1;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  GenericTransactionSignatureChecker<CTransaction> *in_RDX;
  uint256 *in_RSI;
  SignatureCache *in_RDI;
  long in_FS_OFFSET;
  uint256 entry;
  uint256 *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  SignatureCache *this_00;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  SignatureCache *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uint256::uint256(in_stack_ffffffffffffff98);
  SignatureCache::ComputeEntryECDSA
            (in_stack_ffffffffffffffd8,
             (uint256 *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
             (uint256 *)this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RSI,
             (CPubKey *)in_RDX);
  bVar2 = SignatureCache::Get(this_00,in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
  if (bVar2) {
    bVar2 = true;
  }
  else {
    bVar2 = GenericTransactionSignatureChecker<CTransaction>::VerifyECDSASignature
                      (in_RDX,in_RCX,(CPubKey *)in_RDI,
                       (uint256 *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    if (bVar2) {
      if (((in_RDI->m_salted_hasher_ecdsa).buf[8] & 1) != 0) {
        SignatureCache::Set(in_stack_ffffffffffffffd8,
                            (uint256 *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0)
                           );
      }
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CachingTransactionSignatureChecker::VerifyECDSASignature(const std::vector<unsigned char>& vchSig, const CPubKey& pubkey, const uint256& sighash) const
{
    uint256 entry;
    m_signature_cache.ComputeEntryECDSA(entry, sighash, vchSig, pubkey);
    if (m_signature_cache.Get(entry, !store))
        return true;
    if (!TransactionSignatureChecker::VerifyECDSASignature(vchSig, pubkey, sighash))
        return false;
    if (store)
        m_signature_cache.Set(entry);
    return true;
}